

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

optional<cmSwiftCompileMode> __thiscall
cmLocalGenerator::GetSwiftCompileMode
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *config)

{
  bool bVar1;
  cmMakefile *this_00;
  string *psVar2;
  cmSwiftCompileMode local_11c [5];
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  string expandedCompileMode;
  string local_a0;
  cmValue local_80;
  cmValue swiftCompileMode;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue swiftCompileModeDefault;
  cmMakefile *mf;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  
  this_00 = GetMakefile(this);
  swiftCompileModeDefault.Value = (string *)this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_Swift_COMPILATION_MODE_DEFAULT",&local_59);
  local_38 = cmMakefile::GetDefinition(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  swiftCompileMode.Value = local_38.Value;
  bVar1 = cmNonempty(local_38);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Swift_COMPILATION_MODE",
               (allocator<char> *)(expandedCompileMode.field_2._M_local_buf + 0xf));
    local_80 = cmGeneratorTarget::GetProperty(target,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)(expandedCompileMode.field_2._M_local_buf + 0xf));
    bVar1 = cmValue::operator_cast_to_bool(&local_80);
    if (!bVar1) {
      local_80.Value = local_38.Value;
    }
    psVar2 = cmValue::operator*[abi_cxx11_(&local_80);
    std::__cxx11::string::string((string *)&local_e8,(string *)psVar2);
    std::__cxx11::string::string((string *)&local_108);
    cmGeneratorExpression::Evaluate
              ((string *)local_c8,&local_e8,this,config,target,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,"wholemodule");
    if (bVar1) {
      local_11c[4] = 0;
      std::optional<cmSwiftCompileMode>::optional<cmSwiftCompileMode,_true>
                ((optional<cmSwiftCompileMode> *)&this_local,local_11c + 4);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"singlefile");
      if (bVar1) {
        local_11c[2] = 2;
        std::optional<cmSwiftCompileMode>::optional<cmSwiftCompileMode,_true>
                  ((optional<cmSwiftCompileMode> *)&this_local,local_11c + 2);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"incremental");
        if (bVar1) {
          local_11c[1] = 1;
          std::optional<cmSwiftCompileMode>::optional<cmSwiftCompileMode,_true>
                    ((optional<cmSwiftCompileMode> *)&this_local,local_11c + 1);
        }
        else {
          local_11c[0] = Unknown;
          std::optional<cmSwiftCompileMode>::optional<cmSwiftCompileMode,_true>
                    ((optional<cmSwiftCompileMode> *)&this_local,local_11c);
        }
      }
    }
    local_11c[3] = 1;
    std::__cxx11::string::~string((string *)local_c8);
  }
  else {
    std::optional<cmSwiftCompileMode>::optional((optional<cmSwiftCompileMode> *)&this_local);
  }
  return (_Optional_base<cmSwiftCompileMode,_true,_true>)
         (_Optional_base<cmSwiftCompileMode,_true,_true>)this_local;
}

Assistant:

cm::optional<cmSwiftCompileMode> cmLocalGenerator::GetSwiftCompileMode(
  cmGeneratorTarget const* target, std::string const& config)
{
  cmMakefile const* mf = this->GetMakefile();
  cmValue const swiftCompileModeDefault =
    mf->GetDefinition("CMAKE_Swift_COMPILATION_MODE_DEFAULT");
  if (!cmNonempty(swiftCompileModeDefault)) {
    return {};
  }
  cmValue swiftCompileMode = target->GetProperty("Swift_COMPILATION_MODE");
  if (!swiftCompileMode) {
    swiftCompileMode = swiftCompileModeDefault;
  }

  std::string const expandedCompileMode =
    cmGeneratorExpression::Evaluate(*swiftCompileMode, this, config, target);
  if (expandedCompileMode == "wholemodule") {
    return cmSwiftCompileMode::Wholemodule;
  }
  if (expandedCompileMode == "singlefile") {
    return cmSwiftCompileMode::Singlefile;
  }
  if (expandedCompileMode == "incremental") {
    return cmSwiftCompileMode::Incremental;
  }
  return cmSwiftCompileMode::Unknown;
}